

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

int duckdb_brotli::BrotliTransformDictionaryWord
              (uint8_t *dst,uint8_t *word,int len,BrotliTransforms *transforms,int transform_idx)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t *puVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint8_t *puVar17;
  
  puVar5 = transforms->prefix_suffix;
  puVar17 = transforms->transforms;
  lVar8 = (long)transform_idx;
  lVar10 = lVar8 * 3;
  uVar14 = (ulong)transforms->prefix_suffix_map[puVar17[lVar10]];
  bVar1 = puVar17[lVar10 + 1];
  uVar13 = (ulong)transforms->prefix_suffix_map[puVar17[lVar10 + 2]];
  bVar2 = puVar5[uVar14];
  if (bVar2 == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    do {
      dst[uVar16] = puVar5[uVar16 + uVar14 + 1];
      uVar16 = uVar16 + 1;
    } while ((uint)bVar2 != (uint)uVar16);
  }
  if (bVar1 < 10) {
    len = len - (uint)bVar1;
  }
  else if ((byte)(bVar1 - 0xc) < 9) {
    word = word + (bVar1 - 0xb);
    len = len - (bVar1 - 0xb);
  }
  if (0 < len) {
    uVar14 = 0;
    do {
      dst[uVar14 + (uVar16 & 0xffffffff)] = word[uVar14];
      uVar14 = uVar14 + 1;
    } while ((uint)len != uVar14);
    uVar16 = (ulong)(uint)((int)uVar16 + (int)uVar14);
  }
  iVar15 = (int)uVar16;
  if (bVar1 == 0x14 || bVar1 < 0x14) {
    if (bVar1 == 10) {
      lVar10 = (long)(iVar15 - len);
      bVar1 = dst[lVar10];
      if (bVar1 < 0xc0) {
        if ((byte)(bVar1 + 0x9f) < 0x1a) {
          dst[lVar10] = bVar1 & 0x5f;
        }
      }
      else if (bVar1 < 0xe0) {
        dst[lVar10 + 1] = dst[lVar10 + 1] ^ 0x20;
      }
      else {
        dst[lVar10 + 2] = dst[lVar10 + 2] ^ 5;
      }
    }
    else if ((bVar1 == 0xb) && (0 < len)) {
      pbVar9 = dst + (iVar15 - len);
      do {
        bVar1 = *pbVar9;
        if (bVar1 < 0xc0) {
          uVar12 = 1;
          if ((byte)(bVar1 + 0x9f) < 0x1a) {
            *pbVar9 = bVar1 & 0x5f;
          }
        }
        else if (bVar1 < 0xe0) {
          pbVar9[1] = pbVar9[1] ^ 0x20;
          uVar12 = 2;
        }
        else {
          pbVar9[2] = pbVar9[2] ^ 5;
          uVar12 = 3;
        }
        pbVar9 = pbVar9 + uVar12;
        uVar11 = len - uVar12;
        bVar6 = (int)uVar12 <= len;
        len = uVar11;
      } while (uVar11 != 0 && bVar6);
    }
  }
  else if (bVar1 == 0x15) {
    Shift(dst + (iVar15 - len),len,
          CONCAT11(transforms->params[(long)(transform_idx * 2) + 1],transforms->params[lVar8 * 2]))
    ;
  }
  else if ((bVar1 == 0x16) && (0 < len)) {
    uVar3 = transforms->params[lVar8 * 2];
    uVar4 = transforms->params[(long)(transform_idx * 2) + 1];
    puVar17 = dst + (iVar15 - len);
    do {
      iVar7 = Shift(puVar17,len,CONCAT11(uVar4,uVar3));
      puVar17 = puVar17 + iVar7;
      uVar12 = len - iVar7;
      bVar6 = iVar7 <= len;
      len = uVar12;
    } while (uVar12 != 0 && bVar6);
  }
  bVar1 = puVar5[uVar13];
  if (bVar1 != 0) {
    lVar10 = 0;
    do {
      dst[lVar10 + (uVar16 & 0xffffffff)] = puVar5[lVar10 + uVar13 + 1];
      lVar10 = lVar10 + 1;
    } while ((uint)bVar1 != (uint)lVar10);
    iVar15 = iVar15 + (uint)lVar10;
  }
  return iVar15;
}

Assistant:

int duckdb_brotli::BrotliTransformDictionaryWord(uint8_t* dst, const uint8_t* word, int len,
    const BrotliTransforms* transforms, int transform_idx) {
  int idx = 0;
  const uint8_t* prefix = BROTLI_TRANSFORM_PREFIX(transforms, transform_idx);
  uint8_t type = BROTLI_TRANSFORM_TYPE(transforms, transform_idx);
  const uint8_t* suffix = BROTLI_TRANSFORM_SUFFIX(transforms, transform_idx);
  {
    int prefix_len = *prefix++;
    while (prefix_len--) { dst[idx++] = *prefix++; }
  }
  {
    const int t = type;
    int i = 0;
    if (t <= BROTLI_TRANSFORM_OMIT_LAST_9) {
      len -= t;
    } else if (t >= BROTLI_TRANSFORM_OMIT_FIRST_1
        && t <= BROTLI_TRANSFORM_OMIT_FIRST_9) {
      int skip = t - (BROTLI_TRANSFORM_OMIT_FIRST_1 - 1);
      word += skip;
      len -= skip;
    }
    while (i < len) { dst[idx++] = word[i++]; }
    if (t == BROTLI_TRANSFORM_UPPERCASE_FIRST) {
      ToUpperCase(&dst[idx - len]);
    } else if (t == BROTLI_TRANSFORM_UPPERCASE_ALL) {
      uint8_t* uppercase = &dst[idx - len];
      while (len > 0) {
        int step = ToUpperCase(uppercase);
        uppercase += step;
        len -= step;
      }
    } else if (t == BROTLI_TRANSFORM_SHIFT_FIRST) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      Shift(&dst[idx - len], len, param);
    } else if (t == BROTLI_TRANSFORM_SHIFT_ALL) {
      uint16_t param = (uint16_t)(transforms->params[transform_idx * 2]
          + (transforms->params[transform_idx * 2 + 1] << 8u));
      uint8_t* shift = &dst[idx - len];
      while (len > 0) {
        int step = Shift(shift, len, param);
        shift += step;
        len -= step;
      }
    }
  }
  {
    int suffix_len = *suffix++;
    while (suffix_len--) { dst[idx++] = *suffix++; }
    return idx;
  }
}